

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * __thiscall
ON_Font::GetManagedFont
          (ON_Font *this,wchar_t *face_name,Weight font_weight,Style font_style,Stretch font_stretch
          ,bool bUnderlined,bool bStrikethrough,double linefeed_ratio,uint logfont_charset)

{
  ON_Font *pOVar1;
  double in_XMM1_Qa;
  undefined3 in_stack_00000009;
  
  pOVar1 = GetManagedFont(0.0,(wchar_t *)this,(Weight)face_name,font_weight,font_style,
                          (bool)font_stretch,bUnderlined,in_XMM1_Qa,_bStrikethrough);
  return pOVar1;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  const wchar_t* face_name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough,
  double linefeed_ratio,
  unsigned int logfont_charset
)
{
  return ON_Font::GetManagedFont(
    0.0, // point_size
    face_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough,
    linefeed_ratio,
    logfont_charset
  );
}